

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v11::vprint_buffered(FILE *f,string_view fmt,format_args args)

{
  string_view text;
  FILE *f_00;
  size_t count;
  char *in_RDI;
  memory_buffer buffer;
  allocator<char> *in_stack_fffffffffffffd58;
  buffer<char> *this;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd70;
  locale_ref local_270 [6];
  buffer<char> local_240 [4];
  buffer<char> *in_stack_fffffffffffffe48;
  locale_ref in_stack_fffffffffffffe50;
  format_args in_stack_fffffffffffffe58;
  string_view in_stack_fffffffffffffe68;
  
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  detail::locale_ref::locale_ref(local_270);
  detail::vformat_to(in_stack_fffffffffffffe48,in_stack_fffffffffffffe68,in_stack_fffffffffffffe58,
                     in_stack_fffffffffffffe50);
  this = local_240;
  f_00 = (FILE *)detail::buffer<char>::data(this);
  count = detail::buffer<char>::size(this);
  basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)&stack0xfffffffffffffd70,(char *)f_00,count);
  text.size_ = (size_t)in_stack_fffffffffffffd70;
  text.data_ = in_RDI;
  detail::print(f_00,text);
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)0x2a1b14);
  return;
}

Assistant:

FMT_FUNC void vprint_buffered(std::FILE* f, string_view fmt, format_args args) {
  auto buffer = memory_buffer();
  detail::vformat_to(buffer, fmt, args);
  detail::print(f, {buffer.data(), buffer.size()});
}